

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeInteger.c
# Opt level: O0

asn_dec_rval_t
NativeInteger_decode_uper
          (asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,
          asn_per_constraints_t *constraints,void **sptr,asn_per_data_t *pd)

{
  long lVar1;
  int iVar2;
  INTEGER_t *iptr;
  undefined8 *in_RCX;
  undefined8 *in_RSI;
  asn_dec_rval_t aVar3;
  void *tmpintptr;
  INTEGER_t tmpint;
  long *native;
  asn_dec_rval_t rval;
  asn_INTEGER_specifics_t *specs;
  asn_dec_rval_t tmp_error;
  char *local_88;
  unsigned_long *lptr;
  INTEGER_t *in_stack_ffffffffffffff98;
  long *in_stack_ffffffffffffffa0;
  ulong local_50;
  ulong local_10;
  size_t local_8;
  
  lVar1 = in_RSI[0x13];
  iptr = (INTEGER_t *)*in_RCX;
  lptr = (unsigned_long *)&stack0xffffffffffffff98;
  ASN_DEBUG("Decoding NativeInteger %s (UPER)");
  if (iptr == (INTEGER_t *)0x0) {
    iptr = (INTEGER_t *)calloc(1,8);
    *in_RCX = iptr;
    if (iptr == (INTEGER_t *)0x0) {
      local_10 = 2;
      local_8 = 0;
      if (in_RSI == (undefined8 *)0x0) {
        local_88 = "";
      }
      else {
        local_88 = (char *)*in_RSI;
      }
      ASN_DEBUG("Failed to decode element %s",local_88);
      goto LAB_00153b64;
    }
  }
  memset(&stack0xffffffffffffff98,0,0x10);
  aVar3 = INTEGER_decode_uper((asn_codec_ctx_t *)pd,(asn_TYPE_descriptor_t *)specs,
                              (asn_per_constraints_t *)rval.consumed,(void **)rval._0_8_,
                              (asn_per_data_t *)native);
  local_8 = aVar3.consumed;
  local_50 = (ulong)aVar3.code;
  if (aVar3.code == RC_OK) {
    if ((lVar1 == 0) || (*(int *)(lVar1 + 0x20) == 0)) {
      iVar2 = asn_INTEGER2long(iptr,in_stack_ffffffffffffffa0);
    }
    else {
      iVar2 = asn_INTEGER2ulong(in_stack_ffffffffffffff98,lptr);
    }
    if (iVar2 == 0) {
      ASN_DEBUG("NativeInteger %s got value %ld",*in_RSI,iptr->buf);
    }
    else {
      local_50 = 2;
    }
  }
  (*asn_DEF_INTEGER.free_struct)(&asn_DEF_INTEGER,&stack0xffffffffffffff98,1);
  local_10 = local_50;
LAB_00153b64:
  aVar3.consumed = local_8;
  aVar3._0_8_ = local_10;
  return aVar3;
}

Assistant:

asn_dec_rval_t
NativeInteger_decode_uper(asn_codec_ctx_t *opt_codec_ctx,
	asn_TYPE_descriptor_t *td,
	asn_per_constraints_t *constraints, void **sptr, asn_per_data_t *pd) {

	asn_INTEGER_specifics_t *specs=(asn_INTEGER_specifics_t *)td->specifics;
	asn_dec_rval_t rval;
	long *native = (long *)*sptr;
	INTEGER_t tmpint;
	void *tmpintptr = &tmpint;

	(void)opt_codec_ctx;
	ASN_DEBUG("Decoding NativeInteger %s (UPER)", td->name);

	if(!native) {
		native = (long *)(*sptr = CALLOC(1, sizeof(*native)));
		if(!native) ASN__DECODE_FAILED;
	}

	memset(&tmpint, 0, sizeof tmpint);
	rval = INTEGER_decode_uper(opt_codec_ctx, td, constraints,
				   &tmpintptr, pd);
	if(rval.code == RC_OK) {
		if((specs&&specs->field_unsigned)
			? asn_INTEGER2ulong(&tmpint, (unsigned long *)native)
			: asn_INTEGER2long(&tmpint, native))
			rval.code = RC_FAIL;
		else
			ASN_DEBUG("NativeInteger %s got value %ld",
				td->name, *native);
	}
	ASN_STRUCT_FREE_CONTENTS_ONLY(asn_DEF_INTEGER, &tmpint);

	return rval;
}